

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_write_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  size_t sVar1;
  uchar *puVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  sVar1 = mbedtls_mpi_bitlen(X);
  uVar4 = sVar1 + 7 >> 3;
  iVar6 = -8;
  if (uVar4 <= buflen) {
    iVar6 = 0;
    memset(buf,0,buflen);
    if (7 < sVar1 + 7) {
      puVar2 = buf + buflen;
      iVar6 = 0;
      bVar3 = 0;
      uVar5 = 0;
      do {
        puVar2 = puVar2 + -1;
        *puVar2 = (uchar)(*(ulong *)((long)X->p + (uVar5 & 0xfffffffffffffff8)) >> (bVar3 & 0x38));
        uVar5 = uVar5 + 1;
        bVar3 = bVar3 + 8;
      } while (uVar4 != uVar5);
    }
  }
  return iVar6;
}

Assistant:

int mbedtls_mpi_write_binary( const mbedtls_mpi *X, unsigned char *buf, size_t buflen )
{
    size_t i, j, n;

    n = mbedtls_mpi_size( X );

    if( buflen < n )
        return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );

    memset( buf, 0, buflen );

    for( i = buflen - 1, j = 0; n > 0; i--, j++, n-- )
        buf[i] = (unsigned char)( X->p[j / ciL] >> ((j % ciL) << 3) );

    return( 0 );
}